

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O3

void cf_chacha20_next_block(void *vctx,uint8_t *out)

{
  uint8_t *nonce;
  uint8_t uVar1;
  long lVar2;
  long lVar3;
  
  nonce = (uint8_t *)((long)vctx + 0x20);
  cf_chacha20_core((uint8_t *)vctx,(uint8_t *)((long)vctx + 0x10),nonce,
                   *(uint8_t **)((long)vctx + 0x30),out);
  lVar2 = *(long *)((long)vctx + 0x80);
  lVar3 = 0;
  do {
    uVar1 = nonce[lVar3];
    nonce[lVar3] = uVar1 + '\x01';
    if (lVar2 + -1 == lVar3) {
      return;
    }
    lVar3 = lVar3 + 1;
  } while ((uint8_t)(uVar1 + '\x01') == '\0');
  return;
}

Assistant:

static void cf_chacha20_next_block(void *vctx, uint8_t *out)
{
  cf_chacha20_ctx *ctx = vctx;
  cf_chacha20_core(ctx->key0,
                   ctx->key1,
                   ctx->nonce,
                   ctx->constant,
                   out);
  incr_le(ctx->nonce, ctx->ncounter);
}